

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O0

void __thiscall cfd::core::DescriptorNode::AnalyzeAll(DescriptorNode *this,string *parent_name)

{
  pointer *__return_storage_ptr__;
  __type _Var1;
  bool bVar2;
  uint uVar3;
  uint32_t uVar4;
  ulong uVar5;
  char *miniscript_00;
  uchar *script_00;
  size_type sVar6;
  long lVar7;
  undefined8 uVar8;
  reference pvVar9;
  reference this_00;
  size_t sVar10;
  string *message;
  vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_> *this_01;
  char *in_stack_ffffffffffffefc8;
  DescriptorScriptReference *in_stack_ffffffffffffefd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffefd8;
  string *in_stack_ffffffffffffefe0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffefe8;
  CfdError CVar12;
  allocator *paVar11;
  CfdException *in_stack_ffffffffffffeff0;
  CfdException *this_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffeff8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff010;
  char *in_stack_fffffffffffff018;
  allocator local_dc9;
  string local_dc8 [32];
  CfdSourceLocation local_da8;
  undefined1 local_d8a;
  allocator local_d89;
  string local_d88 [32];
  CfdSourceLocation local_d68;
  undefined1 local_d4a;
  allocator local_d49;
  string local_d48 [32];
  CfdSourceLocation local_d28;
  undefined1 local_d0a;
  allocator local_d09;
  string local_d08 [32];
  CfdSourceLocation local_ce8;
  undefined1 local_cca;
  allocator local_cc9;
  string local_cc8 [32];
  CfdSourceLocation local_ca8;
  undefined1 local_c8a;
  allocator local_c89;
  string local_c88 [32];
  CfdSourceLocation local_c68;
  undefined1 local_c4a;
  allocator local_c49;
  string local_c48 [32];
  size_type local_c28;
  CfdSourceLocation local_c20;
  TapBranch local_c08;
  allocator local_b89;
  value_type local_b88;
  uint local_b68;
  undefined1 local_b62;
  allocator local_b61;
  uint32_t index;
  CfdSourceLocation local_b40;
  Pubkey local_b28;
  allocator local_b09;
  value_type local_b08;
  undefined1 local_ae8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  temp_args_1;
  size_type local_aa8;
  CfdSourceLocation local_aa0;
  ByteData local_a88;
  size_t local_a70;
  CfdSourceLocation local_a68;
  undefined1 local_a50 [8];
  Script script_2;
  CfdSourceLocation local_9f8;
  undefined1 local_9e0 [8];
  Address addr;
  string local_860 [32];
  CfdSourceLocation local_840;
  Pubkey local_828;
  allocator local_809;
  value_type local_808;
  reference local_7e8;
  DescriptorNode *child_1;
  iterator __end5;
  iterator __begin5;
  vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_> *__range5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  temp_args;
  string local_7a8 [32];
  ByteData local_788;
  size_t local_770;
  CfdSourceLocation local_768;
  ByteData local_750;
  undefined1 local_738 [8];
  Script script_1;
  DescriptorScriptReference ref;
  DescriptorNode *child;
  iterator __end3;
  iterator __begin3;
  vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_> *__range3;
  string local_388 [32];
  unsigned_long local_368;
  CfdSourceLocation local_360;
  ulong local_348;
  size_t max_pubkey_num;
  string local_338 [32];
  CfdSourceLocation local_318;
  ulong local_300;
  size_t pubkey_num;
  string local_2f0 [32];
  size_type local_2d0;
  CfdSourceLocation local_2c8;
  undefined1 local_2aa;
  allocator local_2a9;
  string local_2a8 [32];
  CfdSourceLocation local_288;
  undefined1 local_26a;
  allocator local_269;
  string local_268 [32];
  size_type local_248;
  CfdSourceLocation local_240;
  undefined1 local_222;
  allocator local_221;
  string local_220 [32];
  CfdSourceLocation local_200;
  undefined1 local_1e2;
  allocator local_1e1;
  string local_1e0 [32];
  CfdSourceLocation local_1c0;
  undefined1 local_1a2;
  allocator local_1a1;
  string local_1a0 [32];
  CfdSourceLocation local_180;
  undefined1 local_162;
  allocator local_161;
  string local_160 [32];
  CfdSourceLocation local_140;
  int local_128;
  uint32_t local_124;
  int ret;
  uint32_t flags;
  size_t written;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_110 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> script;
  string local_d8 [32];
  string local_b8 [8];
  string miniscript;
  size_t max_size;
  DescriptorNodeScriptData *node_data;
  DescriptorNodeScriptData *__end2;
  DescriptorNodeScriptData *__begin2;
  DescriptorNodeScriptData (*__range2) [11];
  DescriptorNodeScriptData *p_data;
  allocator local_51;
  string local_50 [32];
  CfdSourceLocation local_30;
  string *local_18;
  string *parent_name_local;
  DescriptorNode *this_local;
  
  if (this->node_type_ != kDescriptorTypeNumber) {
    local_18 = parent_name;
    parent_name_local = &this->name_;
    if (this->node_type_ == kDescriptorTypeKey) {
      AnalyzeKey(this);
    }
    else {
      uVar5 = ::std::__cxx11::string::empty();
      if ((uVar5 & 1) != 0) {
        local_30.filename =
             strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_descriptor.cpp"
                     ,0x2f);
        CVar12 = (CfdError)((ulong)in_stack_ffffffffffffefe8 >> 0x20);
        local_30.filename = local_30.filename + 1;
        local_30.line = 0x4eb;
        local_30.funcname = "AnalyzeAll";
        logger::warn<>(&local_30,"Failed to name field empty. Analyze NG.");
        uVar8 = __cxa_allocate_exception(0x30);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_50,"Failed to analyze descriptor.",&local_51);
        CfdException::CfdException(in_stack_ffffffffffffeff0,CVar12,in_stack_ffffffffffffefe0);
        __cxa_throw(uVar8,&CfdException::typeinfo,CfdException::~CfdException);
      }
      __range2 = (DescriptorNodeScriptData (*) [11])0x0;
      for (__end2 = (DescriptorNodeScriptData *)kDescriptorNodeScriptTable;
          __end2 != (DescriptorNodeScriptData *)
                    &GenerateChecksum(std::__cxx11::string_const&)::kInputCharset_abi_cxx11_;
          __end2 = __end2 + 1) {
        _Var1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_ffffffffffffeff0,in_stack_ffffffffffffefe8);
        if (_Var1) {
          __range2 = (DescriptorNodeScriptData (*) [11])__end2;
          break;
        }
      }
      if (__range2 == (DescriptorNodeScriptData (*) [11])0x0) {
        bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8);
        if (((!bVar2) &&
            (bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8),
            !bVar2)) &&
           (bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8),
           !bVar2)) {
          local_180.filename =
               strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_descriptor.cpp"
                       ,0x2f);
          CVar12 = (CfdError)((ulong)in_stack_ffffffffffffefe8 >> 0x20);
          local_180.filename = local_180.filename + 1;
          local_180.line = 0x517;
          local_180.funcname = "AnalyzeAll";
          logger::warn<>(&local_180,"Failed to analyze descriptor. script\'s name not found.");
          local_1a2 = 1;
          uVar8 = __cxa_allocate_exception(0x30);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string(local_1a0,"Failed to analyze descriptor.",&local_1a1);
          CfdException::CfdException(in_stack_ffffffffffffeff0,CVar12,in_stack_ffffffffffffefe0);
          local_1a2 = 0;
          __cxa_throw(uVar8,&CfdException::typeinfo,CfdException::~CfdException);
        }
        bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8);
        miniscript.field_2._8_8_ = 10000;
        if (bVar2) {
          miniscript.field_2._8_8_ = 0x208;
        }
        ::std::operator+(in_stack_ffffffffffffeff8,(char *)in_stack_ffffffffffffeff0);
        ::std::operator+(in_stack_ffffffffffffefd8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffefd0);
        ::std::operator+(in_stack_ffffffffffffefd8,(char *)in_stack_ffffffffffffefd0);
        ::std::__cxx11::string::~string(local_d8);
        ::std::__cxx11::string::~string
                  ((string *)
                   &script.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                    .super__Vector_impl_data._M_end_of_storage);
        ::std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x41138b);
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_ffffffffffffeff0,(size_type)in_stack_ffffffffffffefe8,
                   (allocator_type *)in_stack_ffffffffffffefe0);
        CVar12 = (CfdError)((ulong)in_stack_ffffffffffffefe8 >> 0x20);
        ::std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x4113b3);
        _ret = 0;
        local_124 = 0;
        bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8);
        if (bVar2) {
          local_124 = 1;
        }
        miniscript_00 = (char *)::std::__cxx11::string::c_str();
        uVar4 = local_124;
        script_00 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x41148f);
        sVar6 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_110);
        local_128 = wally_descriptor_parse_miniscript
                              (miniscript_00,(char **)0x0,(char **)0x0,0,0,uVar4,script_00,sVar6,
                               (size_t *)&ret);
        if (local_128 != 0) {
          local_140.filename =
               strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_descriptor.cpp"
                       ,0x2f);
          local_140.filename = local_140.filename + 1;
          local_140.line = 0x50e;
          local_140.funcname = "AnalyzeAll";
          logger::warn<>(&local_140,"Failed to analyze descriptor. parse miniscript fail.");
          local_162 = 1;
          uVar8 = __cxa_allocate_exception(0x30);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_160,"Failed to analyze descriptor. parse miniscript fail.",&local_161);
          CfdException::CfdException(in_stack_ffffffffffffeff0,CVar12,in_stack_ffffffffffffefe0);
          local_162 = 0;
          __cxa_throw(uVar8,&CfdException::typeinfo,CfdException::~CfdException);
        }
        this->script_type_ = kDescriptorScriptMiniscript;
        ::std::__cxx11::string::operator=((string *)&this->value_,local_b8);
        ::std::__cxx11::string::operator=((string *)this,"miniscript");
        this->number_ = (uint32_t)_ret;
        lVar7 = ::std::__cxx11::string::find((char *)local_b8,0x85bf3c);
        this->need_arg_num_ = (uint)(lVar7 != -1);
        ::std::vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>::clear
                  (&this->child_node_);
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_ffffffffffffefe0);
        ::std::__cxx11::string::~string(local_b8);
      }
      else {
        if ((((*__range2)[0].top_only & 1U) != 0) && (this->depth_ != 0)) {
          local_1c0.filename =
               strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_descriptor.cpp"
                       ,0x2f);
          CVar12 = (CfdError)((ulong)in_stack_ffffffffffffefe8 >> 0x20);
          local_1c0.filename = local_1c0.filename + 1;
          local_1c0.line = 0x51f;
          local_1c0.funcname = "AnalyzeAll";
          logger::warn<>(&local_1c0,
                         "Failed to analyse descriptor. The target can only exist at the top.");
          local_1e2 = 1;
          uVar8 = __cxa_allocate_exception(0x30);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_1e0,"Failed to analyse descriptor. The target can only exist at the top."
                     ,&local_1e1);
          CfdException::CfdException(in_stack_ffffffffffffeff0,CVar12,in_stack_ffffffffffffefe0);
          local_1e2 = 0;
          __cxa_throw(uVar8,&CfdException::typeinfo,CfdException::~CfdException);
        }
        if (((*__range2)[0].has_child & 1U) == 0) {
          bVar2 = ::std::
                  vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>::
                  empty(&this->child_node_);
          CVar12 = (CfdError)((ulong)in_stack_ffffffffffffefe8 >> 0x20);
          if (!bVar2) {
            local_240.filename =
                 strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_descriptor.cpp"
                         ,0x2f);
            local_240.filename = local_240.filename + 1;
            local_240.line = 0x52d;
            local_240.funcname = "AnalyzeAll";
            local_248 = ::std::
                        vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
                        ::size(&this->child_node_);
            logger::warn<unsigned_long>(&local_240,"Failed to child node num. size={}",&local_248);
            local_26a = 1;
            uVar8 = __cxa_allocate_exception(0x30);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string(local_268,"Failed to child node num.",&local_269);
            CfdException::CfdException(in_stack_ffffffffffffeff0,CVar12,in_stack_ffffffffffffefe0);
            local_26a = 0;
            __cxa_throw(uVar8,&CfdException::typeinfo,CfdException::~CfdException);
          }
        }
        else {
          bVar2 = ::std::
                  vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>::
                  empty(&this->child_node_);
          CVar12 = (CfdError)((ulong)in_stack_ffffffffffffefe8 >> 0x20);
          if (bVar2) {
            local_200.filename =
                 strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_descriptor.cpp"
                         ,0x2f);
            local_200.filename = local_200.filename + 1;
            local_200.line = 0x527;
            local_200.funcname = "AnalyzeAll";
            logger::warn<>(&local_200,"Failed to child node empty.");
            local_222 = 1;
            uVar8 = __cxa_allocate_exception(0x30);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string(local_220,"Failed to child node empty.",&local_221);
            CfdException::CfdException(in_stack_ffffffffffffeff0,CVar12,in_stack_ffffffffffffefe0);
            local_222 = 0;
            __cxa_throw(uVar8,&CfdException::typeinfo,CfdException::~CfdException);
          }
        }
        CVar12 = (CfdError)((ulong)in_stack_ffffffffffffefe8 >> 0x20);
        if (((*__range2)[0].multisig & 1U) == 0) {
          bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8);
          if (bVar2) {
            core::Address::Address((Address *)local_9e0,&this->value_,&this->addr_prefixes_);
            local_9f8.filename =
                 strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_descriptor.cpp"
                         ,0x2f);
            local_9f8.filename = local_9f8.filename + 1;
            local_9f8.line = 0x578;
            local_9f8.funcname = "AnalyzeAll";
            core::Address::GetAddress_abi_cxx11_
                      ((string *)
                       &script_2.script_stack_.
                        super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,(Address *)local_9e0);
            logger::info<std::__cxx11::string>
                      (&local_9f8,"Address={}",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &script_2.script_stack_.
                        super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            ::std::__cxx11::string::~string
                      ((string *)
                       &script_2.script_stack_.
                        super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            core::Address::~Address((Address *)in_stack_ffffffffffffefd0);
          }
          else {
            bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8);
            if (bVar2) {
              Script::Script((Script *)local_a50,&this->value_);
              local_a68.filename =
                   strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_descriptor.cpp"
                           ,0x2f);
              local_a68.filename = local_a68.filename + 1;
              local_a68.line = 0x57b;
              local_a68.funcname = "AnalyzeAll";
              Script::GetData(&local_a88,(Script *)local_a50);
              local_a70 = ByteData::GetDataSize(&local_a88);
              logger::info<unsigned_long>(&local_a68,"script size={}",&local_a70);
              ByteData::~ByteData((ByteData *)0x4129d9);
              Script::~Script((Script *)in_stack_ffffffffffffefd0);
            }
            else {
              bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8);
              if (bVar2) {
                sVar6 = ::std::
                        vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
                        ::size(&this->child_node_);
                if ((sVar6 != 1) &&
                   (sVar6 = ::std::
                            vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
                            ::size(&this->child_node_), sVar6 != 2)) {
                  local_aa0.filename =
                       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_descriptor.cpp"
                               ,0x2f);
                  local_aa0.filename = local_aa0.filename + 1;
                  local_aa0.line = 0x57f;
                  local_aa0.funcname = "AnalyzeAll";
                  local_aa8 = ::std::
                              vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
                              ::size(&this->child_node_);
                  logger::warn<unsigned_long>
                            (&local_aa0,"Failed to taproot node num. size={}",&local_aa8);
                  temp_args_1.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
                  uVar8 = __cxa_allocate_exception(0x30);
                  ::std::
                  vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>::
                  operator[](&this->child_node_,0);
                  ::std::operator+(in_stack_fffffffffffff018,in_stack_fffffffffffff010);
                  CfdException::CfdException
                            (in_stack_ffffffffffffeff0,CVar12,in_stack_ffffffffffffefe0);
                  temp_args_1.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
                  __cxa_throw(uVar8,&CfdException::typeinfo,CfdException::~CfdException);
                }
                this_01 = &this->child_node_;
                pvVar9 = ::std::
                         vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
                         ::operator[](this_01,0);
                pvVar9->node_type_ = kDescriptorTypeKey;
                pvVar9 = ::std::
                         vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
                         ::operator[](this_01,0);
                ::std::__cxx11::string::operator=((string *)&pvVar9->parent_kind_,"tr");
                pvVar9 = ::std::
                         vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
                         ::operator[](this_01,0);
                AnalyzeAll(pvVar9,&this->name_);
                ::std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)0x412c31);
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string((string *)&local_b08,"0",&local_b09);
                ::std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_ae8,&local_b08);
                ::std::__cxx11::string::~string((string *)&local_b08);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_b09);
                pvVar9 = ::std::
                         vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
                         ::operator[](&this->child_node_,0);
                GetPubkey(&local_b28,pvVar9,
                          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_ae8);
                bVar2 = Pubkey::IsCompress(&local_b28);
                Pubkey::~Pubkey((Pubkey *)0x412cea);
                if (((bVar2 ^ 0xffU) & 1) != 0) {
                  local_b40.filename =
                       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_descriptor.cpp"
                               ,0x2f);
                  local_b40.filename = local_b40.filename + 1;
                  local_b40.line = 0x58d;
                  local_b40.funcname = "AnalyzeAll";
                  logger::warn<>(&local_b40,"Failed to taproot pubkey. taproot is compress only.");
                  local_b62 = 1;
                  uVar8 = __cxa_allocate_exception(0x30);
                  ::std::allocator<char>::allocator();
                  ::std::__cxx11::string::string
                            ((string *)&index,
                             "Failed to taproot uncompress pubkey. taproot is compress only.",
                             &local_b61);
                  CfdException::CfdException
                            (in_stack_ffffffffffffeff0,CVar12,in_stack_ffffffffffffefe0);
                  local_b62 = 0;
                  __cxa_throw(uVar8,&CfdException::typeinfo,CfdException::~CfdException);
                }
                sVar6 = ::std::
                        vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
                        ::size(&this->child_node_);
                if (sVar6 == 2) {
                  pvVar9 = ::std::
                           vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
                           ::operator[](&this->child_node_,1);
                  ::std::__cxx11::string::operator=((string *)&pvVar9->parent_kind_,"tr");
                  pvVar9 = ::std::
                           vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
                           ::operator[](&this->child_node_,1);
                  AnalyzeScriptTree(pvVar9);
                  local_b68 = 0;
                  while( true ) {
                    uVar3 = local_b68;
                    pvVar9 = ::std::
                             vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
                             ::operator[](&this->child_node_,1);
                    uVar4 = GetNeedArgumentNum(pvVar9);
                    if (uVar4 <= uVar3) break;
                    ::std::allocator<char>::allocator();
                    ::std::__cxx11::string::string((string *)&local_b88,"0",&local_b89);
                    ::std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_ae8,&local_b88);
                    ::std::__cxx11::string::~string((string *)&local_b88);
                    ::std::allocator<char>::~allocator((allocator<char> *)&local_b89);
                    local_b68 = local_b68 + 1;
                  }
                  pvVar9 = ::std::
                           vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
                           ::operator[](&this->child_node_,1);
                  GetTapBranch(&local_c08,pvVar9,
                               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_ae8);
                  TapBranch::~TapBranch((TapBranch *)in_stack_ffffffffffffefd0);
                }
                ::std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_stack_ffffffffffffefe0);
              }
              else {
                sVar6 = ::std::
                        vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
                        ::size(&this->child_node_);
                if (sVar6 != 1) {
                  local_c20.filename =
                       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_descriptor.cpp"
                               ,0x2f);
                  local_c20.filename = local_c20.filename + 1;
                  local_c20.line = 0x59e;
                  local_c20.funcname = "AnalyzeAll";
                  local_c28 = ::std::
                              vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
                              ::size(&this->child_node_);
                  logger::warn<unsigned_long>
                            (&local_c20,"Failed to child node num. size={}",&local_c28);
                  local_c4a = 1;
                  uVar8 = __cxa_allocate_exception(0x30);
                  ::std::allocator<char>::allocator();
                  ::std::__cxx11::string::string(local_c48,"Failed to child node num.",&local_c49);
                  CfdException::CfdException
                            (in_stack_ffffffffffffeff0,CVar12,in_stack_ffffffffffffefe0);
                  local_c4a = 0;
                  __cxa_throw(uVar8,&CfdException::typeinfo,CfdException::~CfdException);
                }
                bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8);
                if (((bVar2) && (uVar5 = ::std::__cxx11::string::empty(), (uVar5 & 1) == 0)) &&
                   (bVar2 = ::std::operator!=(local_18,"sh"), bVar2)) {
                  local_c68.filename =
                       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_descriptor.cpp"
                               ,0x2f);
                  local_c68.filename = local_c68.filename + 1;
                  local_c68.line = 0x5a4;
                  local_c68.funcname = "AnalyzeAll";
                  logger::warn<>(&local_c68,"Failed to wsh parent. only top or sh.");
                  local_c8a = 1;
                  uVar8 = __cxa_allocate_exception(0x30);
                  ::std::allocator<char>::allocator();
                  ::std::__cxx11::string::string
                            (local_c88,"Failed to wsh parent. only top or sh.",&local_c89);
                  CfdException::CfdException
                            (in_stack_ffffffffffffeff0,CVar12,in_stack_ffffffffffffefe0);
                  local_c8a = 0;
                  __cxa_throw(uVar8,&CfdException::typeinfo,CfdException::~CfdException);
                }
                bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8);
                if (((bVar2) && (uVar5 = ::std::__cxx11::string::empty(), (uVar5 & 1) == 0)) &&
                   (bVar2 = ::std::operator!=(local_18,"sh"), bVar2)) {
                  local_ca8.filename =
                       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_descriptor.cpp"
                               ,0x2f);
                  local_ca8.filename = local_ca8.filename + 1;
                  local_ca8.line = 0x5aa;
                  local_ca8.funcname = "AnalyzeAll";
                  logger::warn<>(&local_ca8,"Failed to wpkh parent. only top or sh.");
                  local_cca = 1;
                  uVar8 = __cxa_allocate_exception(0x30);
                  ::std::allocator<char>::allocator();
                  ::std::__cxx11::string::string
                            (local_cc8,"Failed to wpkh parent. only top or sh.",&local_cc9);
                  CfdException::CfdException
                            (in_stack_ffffffffffffeff0,CVar12,in_stack_ffffffffffffefe0);
                  local_cca = 0;
                  __cxa_throw(uVar8,&CfdException::typeinfo,CfdException::~CfdException);
                }
                bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8);
                if (((bVar2) ||
                    (bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)in_stack_ffffffffffffefd0,
                                               in_stack_ffffffffffffefc8), bVar2)) &&
                   (pvVar9 = ::std::
                             vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
                             ::operator[](&this->child_node_,0),
                   pvVar9->node_type_ != kDescriptorTypeScript)) {
                  local_ce8.filename =
                       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_descriptor.cpp"
                               ,0x2f);
                  local_ce8.filename = local_ce8.filename + 1;
                  local_ce8.line = 0x5b3;
                  local_ce8.funcname = "AnalyzeAll";
                  pvVar9 = ::std::
                           vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
                           ::operator[](&this->child_node_,0);
                  logger::warn<cfd::core::DescriptorNodeType&>
                            (&local_ce8,
                             "Failed to check script type. child is script only. nodetype={}",
                             &pvVar9->node_type_);
                  local_d0a = 1;
                  uVar8 = __cxa_allocate_exception(0x30);
                  ::std::allocator<char>::allocator();
                  ::std::__cxx11::string::string
                            (local_d08,"Failed to check script type. child is script only.",
                             &local_d09);
                  CfdException::CfdException
                            (in_stack_ffffffffffffeff0,CVar12,in_stack_ffffffffffffefe0);
                  local_d0a = 0;
                  __cxa_throw(uVar8,&CfdException::typeinfo,CfdException::~CfdException);
                }
                bVar2 = ::std::operator!=(&this->name_,"wsh");
                if (((bVar2) && (bVar2 = ::std::operator!=(&this->name_,"sh"), bVar2)) &&
                   (pvVar9 = ::std::
                             vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
                             ::operator[](&this->child_node_,0),
                   pvVar9->node_type_ != kDescriptorTypeKey)) {
                  local_d28.filename =
                       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_descriptor.cpp"
                               ,0x2f);
                  local_d28.filename = local_d28.filename + 1;
                  local_d28.line = 0x5be;
                  local_d28.funcname = "AnalyzeAll";
                  pvVar9 = ::std::
                           vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
                           ::operator[](&this->child_node_,0);
                  logger::warn<cfd::core::DescriptorNodeType&>
                            (&local_d28,
                             "Failed to check key-hash type. child is key only. nodetype={}",
                             &pvVar9->node_type_);
                  local_d4a = 1;
                  uVar8 = __cxa_allocate_exception(0x30);
                  paVar11 = &local_d49;
                  ::std::allocator<char>::allocator();
                  ::std::__cxx11::string::string
                            (local_d48,"Failed to check key-hash type. child is key only.",paVar11);
                  CfdException::CfdException
                            (in_stack_ffffffffffffeff0,CVar12,in_stack_ffffffffffffefe0);
                  local_d4a = 0;
                  __cxa_throw(uVar8,&CfdException::typeinfo,CfdException::~CfdException);
                }
                bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8);
                if ((bVar2) &&
                   (bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8
                                             ), bVar2)) {
                  local_d68.filename =
                       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_descriptor.cpp"
                               ,0x2f);
                  local_d68.filename = local_d68.filename + 1;
                  local_d68.line = 0x5c5;
                  local_d68.funcname = "AnalyzeAll";
                  logger::warn<>(&local_d68,"Failed to taproot. pkh is unsupported.");
                  local_d8a = 1;
                  uVar8 = __cxa_allocate_exception(0x30);
                  ::std::allocator<char>::allocator();
                  ::std::__cxx11::string::string
                            (local_d88,"Failed to taproot. pkh is unsupported.",&local_d89);
                  CfdException::CfdException
                            (in_stack_ffffffffffffeff0,CVar12,in_stack_ffffffffffffefe0);
                  local_d8a = 0;
                  __cxa_throw(uVar8,&CfdException::typeinfo,CfdException::~CfdException);
                }
                this_02 = (CfdException *)&this->parent_kind_;
                pvVar9 = ::std::
                         vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
                         ::operator[](&this->child_node_,0);
                ::std::__cxx11::string::operator=((string *)&pvVar9->parent_kind_,(string *)this_02)
                ;
                pvVar9 = ::std::
                         vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
                         ::operator[](&this->child_node_,0);
                AnalyzeAll(pvVar9,&this->name_);
                bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8);
                if (((bVar2) ||
                    (bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)in_stack_ffffffffffffefd0,
                                               in_stack_ffffffffffffefc8), bVar2)) &&
                   (bVar2 = ExistUncompressedKey(this), bVar2)) {
                  local_da8.filename =
                       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_descriptor.cpp"
                               ,0x2f);
                  local_da8.filename = local_da8.filename + 1;
                  local_da8.line = 0x5d0;
                  local_da8.funcname = "AnalyzeAll";
                  logger::warn<>(&local_da8,
                                 "Failed to unsing uncompressed pubkey. witness cannot uncompressed pubkey."
                                );
                  message = (string *)__cxa_allocate_exception(0x30);
                  paVar11 = &local_dc9;
                  ::std::allocator<char>::allocator();
                  ::std::__cxx11::string::string
                            (local_dc8,"Failed to unsing uncompressed pubkey.",paVar11);
                  CfdException::CfdException(this_02,(CfdError)((ulong)paVar11 >> 0x20),message);
                  __cxa_throw(message,&CfdException::typeinfo,CfdException::~CfdException);
                }
              }
            }
          }
        }
        else {
          bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8);
          CVar12 = (CfdError)((ulong)in_stack_ffffffffffffefe8 >> 0x20);
          if (bVar2) {
            local_288.filename =
                 strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_descriptor.cpp"
                         ,0x2f);
            local_288.filename = local_288.filename + 1;
            local_288.line = 0x535;
            local_288.funcname = "AnalyzeAll";
            logger::warn<>(&local_288,"Failed to multisig. taproot is unsupported.");
            local_2aa = 1;
            uVar8 = __cxa_allocate_exception(0x30);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_2a8,"Failed to multisig. taproot is unsupported.",&local_2a9);
            CfdException::CfdException(in_stack_ffffffffffffeff0,CVar12,in_stack_ffffffffffffefe0);
            local_2aa = 0;
            __cxa_throw(uVar8,&CfdException::typeinfo,CfdException::~CfdException);
          }
          sVar6 = ::std::
                  vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>::
                  size(&this->child_node_);
          CVar12 = (CfdError)((ulong)in_stack_ffffffffffffefe8 >> 0x20);
          if (sVar6 < 2) {
            local_2c8.filename =
                 strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_descriptor.cpp"
                         ,0x2f);
            local_2c8.filename = local_2c8.filename + 1;
            local_2c8.line = 0x53c;
            local_2c8.funcname = "AnalyzeAll";
            local_2d0 = ::std::
                        vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
                        ::size(&this->child_node_);
            logger::warn<unsigned_long>
                      (&local_2c8,"Failed to multisig node low. size={}",&local_2d0);
            pubkey_num._6_1_ = 1;
            uVar8 = __cxa_allocate_exception(0x30);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_2f0,"Failed to multisig node low.",(allocator *)((long)&pubkey_num + 7)
                      );
            CfdException::CfdException(in_stack_ffffffffffffeff0,CVar12,in_stack_ffffffffffffefe0);
            pubkey_num._6_1_ = 0;
            __cxa_throw(uVar8,&CfdException::typeinfo,CfdException::~CfdException);
          }
          sVar6 = ::std::
                  vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>::
                  size(&this->child_node_);
          local_300 = sVar6 - 1;
          pvVar9 = ::std::
                   vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>::
                   operator[](&this->child_node_,0);
          uVar5 = local_300;
          CVar12 = (CfdError)((ulong)in_stack_ffffffffffffefe8 >> 0x20);
          if (pvVar9->number_ == 0) {
LAB_00411f13:
            local_318.filename =
                 strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_descriptor.cpp"
                         ,0x2f);
            local_318.filename = local_318.filename + 1;
            local_318.line = 0x545;
            local_318.funcname = "AnalyzeAll";
            pvVar9 = ::std::
                     vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>::
                     operator[](&this->child_node_,0);
            logger::warn<unsigned_int&>
                      (&local_318,"Failed to multisig require num. num={}",&pvVar9->number_);
            max_pubkey_num._6_1_ = 1;
            uVar8 = __cxa_allocate_exception(0x30);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_338,"Failed to multisig require num.",
                       (allocator *)((long)&max_pubkey_num + 7));
            CfdException::CfdException(in_stack_ffffffffffffeff0,CVar12,in_stack_ffffffffffffefe0);
            max_pubkey_num._6_1_ = 0;
            __cxa_throw(uVar8,&CfdException::typeinfo,CfdException::~CfdException);
          }
          pvVar9 = ::std::
                   vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>::
                   operator[](&this->child_node_,0);
          CVar12 = (CfdError)((ulong)in_stack_ffffffffffffefe8 >> 0x20);
          if (uVar5 < pvVar9->number_) goto LAB_00411f13;
          bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8);
          CVar12 = (CfdError)((ulong)in_stack_ffffffffffffefe8 >> 0x20);
          uVar3 = 0x10;
          if (bVar2) {
            uVar3 = 0x14;
          }
          local_348 = (ulong)uVar3;
          if (local_348 < local_300) {
            local_360.filename =
                 strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_descriptor.cpp"
                         ,0x2f);
            local_360.filename = local_360.filename + 1;
            local_360.line = 0x54f;
            local_360.funcname = "AnalyzeAll";
            sVar6 = ::std::
                    vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>::
                    size(&this->child_node_);
            local_368 = sVar6 - 1;
            logger::warn<unsigned_long>
                      (&local_360,"Failed to multisig pubkey num. num={}",&local_368);
            __range3._6_1_ = 1;
            uVar8 = __cxa_allocate_exception(0x30);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_388,"Failed to multisig pubkey num.",(allocator *)((long)&__range3 + 7)
                      );
            CfdException::CfdException(in_stack_ffffffffffffeff0,CVar12,in_stack_ffffffffffffefe0);
            __range3._6_1_ = 0;
            __cxa_throw(uVar8,&CfdException::typeinfo,CfdException::~CfdException);
          }
          __end3 = ::std::
                   vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>::
                   begin(&this->child_node_);
          child = (DescriptorNode *)
                  ::std::
                  vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>::end
                            (&this->child_node_);
          while (bVar2 = __gnu_cxx::operator!=
                                   (&__end3,(__normal_iterator<cfd::core::DescriptorNode_*,_std::vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>_>
                                             *)&child), bVar2) {
            this_00 = __gnu_cxx::
                      __normal_iterator<cfd::core::DescriptorNode_*,_std::vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>_>
                      ::operator*(&__end3);
            AnalyzeAll(this_00,&this->name_);
            __gnu_cxx::
            __normal_iterator<cfd::core::DescriptorNode_*,_std::vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>_>
            ::operator++(&__end3);
          }
          bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8);
          CVar12 = (CfdError)((ulong)in_stack_ffffffffffffefe8 >> 0x20);
          if (bVar2) {
            this->script_type_ = (*__range2)[0].type;
            __return_storage_ptr__ =
                 &script_1.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
            GetReference((DescriptorScriptReference *)__return_storage_ptr__,this,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)0x0,(DescriptorNode *)0x0);
            DescriptorScriptReference::GetLockingScript
                      ((Script *)local_738,(DescriptorScriptReference *)__return_storage_ptr__);
            Script::GetData(&local_750,(Script *)local_738);
            sVar10 = ByteData::GetDataSize(&local_750);
            ByteData::~ByteData((ByteData *)0x4122f8);
            if (0x208 < sVar10 + 3) {
              local_768.filename =
                   strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_descriptor.cpp"
                           ,0x2f);
              local_768.filename = local_768.filename + 1;
              local_768.line = 0x55f;
              local_768.funcname = "AnalyzeAll";
              Script::GetData(&local_788,(Script *)local_738);
              local_770 = ByteData::GetDataSize(&local_788);
              logger::warn<unsigned_long>
                        (&local_768,"Failed to script size over. size={}",&local_770);
              ByteData::~ByteData((ByteData *)0x41239e);
              temp_args.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
              uVar8 = __cxa_allocate_exception(0x30);
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_7a8,"Failed to script size over.",
                         (allocator *)
                         ((long)&temp_args.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
              CfdException::CfdException(in_stack_ffffffffffffeff0,CVar12,in_stack_ffffffffffffefe0)
              ;
              temp_args.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
              __cxa_throw(uVar8,&CfdException::typeinfo,CfdException::~CfdException);
            }
            Script::~Script((Script *)in_stack_ffffffffffffefd0);
            DescriptorScriptReference::~DescriptorScriptReference(in_stack_ffffffffffffefd0);
          }
          else {
            bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8);
            if (bVar2) {
              ::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)0x412528);
              __end5 = ::std::
                       vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
                       ::begin(&this->child_node_);
              child_1 = (DescriptorNode *)
                        ::std::
                        vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
                        ::end(&this->child_node_);
              while (bVar2 = __gnu_cxx::operator!=
                                       (&__end5,(__normal_iterator<cfd::core::DescriptorNode_*,_std::vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>_>
                                                 *)&child_1), bVar2) {
                local_7e8 = __gnu_cxx::
                            __normal_iterator<cfd::core::DescriptorNode_*,_std::vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>_>
                            ::operator*(&__end5);
                if (local_7e8->node_type_ != kDescriptorTypeNumber) {
                  ::std::allocator<char>::allocator();
                  ::std::__cxx11::string::string((string *)&local_808,"0",&local_809);
                  ::std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&__range5,&local_808);
                  ::std::__cxx11::string::~string((string *)&local_808);
                  ::std::allocator<char>::~allocator((allocator<char> *)&local_809);
                  GetPubkey(&local_828,local_7e8,
                            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&__range5);
                  bVar2 = Pubkey::IsCompress(&local_828);
                  Pubkey::~Pubkey((Pubkey *)0x41264c);
                  CVar12 = (CfdError)((ulong)in_stack_ffffffffffffefe8 >> 0x20);
                  if (((bVar2 ^ 0xffU) & 1) != 0) {
                    local_840.filename =
                         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_descriptor.cpp"
                                 ,0x2f);
                    local_840.filename = local_840.filename + 1;
                    local_840.line = 0x56e;
                    local_840.funcname = "AnalyzeAll";
                    logger::warn<>(&local_840,
                                   "Failed to multisig uncompress pubkey. wsh is compress only.");
                    addr.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ =
                         1;
                    uVar8 = __cxa_allocate_exception(0x30);
                    ::std::allocator<char>::allocator();
                    ::std::__cxx11::string::string
                              (local_860,
                               "Failed to multisig uncompress pubkey. wsh is compress only.",
                               (allocator *)
                               ((long)&addr.format_data_.map_._M_t._M_impl.super__Rb_tree_header.
                                       _M_node_count + 7));
                    CfdException::CfdException
                              (in_stack_ffffffffffffeff0,CVar12,in_stack_ffffffffffffefe0);
                    addr.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ =
                         0;
                    __cxa_throw(uVar8,&CfdException::typeinfo,CfdException::~CfdException);
                  }
                }
                __gnu_cxx::
                __normal_iterator<cfd::core::DescriptorNode_*,_std::vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>_>
                ::operator++(&__end5);
              }
              ::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_ffffffffffffefe0);
            }
          }
        }
        this->script_type_ = (*__range2)[0].type;
      }
    }
  }
  return;
}

Assistant:

void DescriptorNode::AnalyzeAll(const std::string& parent_name) {
  if (node_type_ == DescriptorNodeType::kDescriptorTypeNumber) {
    return;
  }
  if (node_type_ == DescriptorNodeType::kDescriptorTypeKey) {
    AnalyzeKey();
    return;
  }
  if (name_.empty()) {
    warn(CFD_LOG_SOURCE, "Failed to name field empty. Analyze NG.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Failed to analyze descriptor.");
  }

  const DescriptorNodeScriptData* p_data = nullptr;
  for (const auto& node_data : kDescriptorNodeScriptTable) {
    if (name_ == node_data.name) {
      p_data = &node_data;
      break;
    }
  }
  if (p_data == nullptr) {
    if ((parent_name == "wsh") || (parent_name == "sh") ||
        (parent_name == "tr")) {
      size_t max_size = (parent_name == "sh") ? Script::kMaxRedeemScriptSize
                                              : Script::kMaxScriptSize;
      std::string miniscript = name_ + "(" + value_ + ")";
      std::vector<unsigned char> script(max_size);
      size_t written = 0;
      uint32_t flags = WALLY_MINISCRIPT_WITNESS_SCRIPT;
      if (parent_name == "tr") flags = WALLY_MINISCRIPT_TAPSCRIPT;
      int ret = wally_descriptor_parse_miniscript(
          miniscript.c_str(), nullptr, nullptr, 0, 0, flags, script.data(),
          script.size(), &written);
      if (ret == WALLY_OK) {
        script_type_ = DescriptorScriptType::kDescriptorScriptMiniscript;
        value_ = miniscript;
        name_ = "miniscript";
        number_ = static_cast<uint32_t>(written);
        need_arg_num_ = (miniscript.find("*") != std::string::npos) ? 1 : 0;
        child_node_.clear();
        return;
      } else {
        warn(
            CFD_LOG_SOURCE,
            "Failed to analyze descriptor. parse miniscript fail.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to analyze descriptor. parse miniscript fail.");
      }
    }

    warn(
        CFD_LOG_SOURCE,
        "Failed to analyze descriptor. script's name not found.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Failed to analyze descriptor.");
  }

  if (p_data->top_only && (depth_ != 0)) {
    warn(
        CFD_LOG_SOURCE,
        "Failed to analyse descriptor. The target can only exist at the top.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Failed to analyse descriptor. The target can only exist at the top.");
  }
  if (p_data->has_child) {
    if (child_node_.empty()) {
      warn(CFD_LOG_SOURCE, "Failed to child node empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Failed to child node empty.");
    }
  } else if (!child_node_.empty()) {
    warn(
        CFD_LOG_SOURCE, "Failed to child node num. size={}",
        child_node_.size());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Failed to child node num.");
  }

  if (p_data->multisig) {
    if (parent_kind_ == "tr") {
      warn(CFD_LOG_SOURCE, "Failed to multisig. taproot is unsupported.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to multisig. taproot is unsupported.");
    }
    if (child_node_.size() < 2) {
      warn(
          CFD_LOG_SOURCE, "Failed to multisig node low. size={}",
          child_node_.size());
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Failed to multisig node low.");
    }
    size_t pubkey_num = child_node_.size() - 1;
    if ((child_node_[0].number_ == 0) ||
        (pubkey_num < static_cast<size_t>(child_node_[0].number_))) {
      warn(
          CFD_LOG_SOURCE, "Failed to multisig require num. num={}",
          child_node_[0].number_);
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to multisig require num.");
    }
    size_t max_pubkey_num =
        (parent_name == "wsh") ? Script::kMaxMultisigPubkeyNum : 16;
    if (pubkey_num > max_pubkey_num) {
      warn(
          CFD_LOG_SOURCE, "Failed to multisig pubkey num. num={}",
          child_node_.size() - 1);
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to multisig pubkey num.");
    }
    for (auto& child : child_node_) {
      child.AnalyzeAll(name_);
    }
    if (parent_name == "sh") {
      script_type_ = p_data->type;
      DescriptorScriptReference ref = GetReference(nullptr);
      Script script = ref.GetLockingScript();
      if ((script.GetData().GetDataSize() + 3) >
          Script::kMaxRedeemScriptSize) {
        warn(
            CFD_LOG_SOURCE, "Failed to script size over. size={}",
            script.GetData().GetDataSize());
        throw CfdException(
            CfdError::kCfdIllegalArgumentError, "Failed to script size over.");
      }
    } else if (parent_name == "wsh") {
      // check compress pubkey
      std::vector<std::string> temp_args;
      for (auto& child : child_node_) {
        if (child.node_type_ == DescriptorNodeType::kDescriptorTypeNumber) {
          continue;
        }
        temp_args.push_back("0");
        if (!child.GetPubkey(&temp_args).IsCompress()) {
          warn(
              CFD_LOG_SOURCE,
              "Failed to multisig uncompress pubkey. wsh is compress only.");
          throw CfdException(
              CfdError::kCfdIllegalArgumentError,
              "Failed to multisig uncompress pubkey. wsh is compress only.");
        }
      }
    }
  } else if (name_ == "addr") {
    Address addr(value_, addr_prefixes_);
    info(CFD_LOG_SOURCE, "Address={}", addr.GetAddress());
  } else if (name_ == "raw") {
    Script script(value_);
    info(CFD_LOG_SOURCE, "script size={}", script.GetData().GetDataSize());
  } else if (name_ == "tr") {
    if ((child_node_.size() != 1) && (child_node_.size() != 2)) {
      warn(
          CFD_LOG_SOURCE, "Failed to taproot node num. size={}",
          child_node_.size());
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to taproot node num." + child_node_[0].value_);
    }
    child_node_[0].node_type_ = DescriptorNodeType::kDescriptorTypeKey;
    child_node_[0].parent_kind_ = "tr";
    child_node_[0].AnalyzeAll(name_);

    std::vector<std::string> temp_args;
    temp_args.push_back("0");
    if (!child_node_[0].GetPubkey(&temp_args).IsCompress()) {
      warn(
          CFD_LOG_SOURCE,
          "Failed to taproot pubkey. taproot is compress only.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to taproot uncompress pubkey. taproot is compress only.");
    }
    if (child_node_.size() == 2) {
      child_node_[1].parent_kind_ = "tr";
      child_node_[1].AnalyzeScriptTree();
      for (uint32_t index = 0; index < child_node_[1].GetNeedArgumentNum();
           ++index) {
        temp_args.push_back("0");
      }
      child_node_[1].GetTapBranch(&temp_args);  // check
    }
  } else if (child_node_.size() != 1) {
    warn(
        CFD_LOG_SOURCE, "Failed to child node num. size={}",
        child_node_.size());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Failed to child node num.");
  } else {
    if ((name_ == "wsh") && (!parent_name.empty()) && (parent_name != "sh")) {
      warn(CFD_LOG_SOURCE, "Failed to wsh parent. only top or sh.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to wsh parent. only top or sh.");
    } else if (
        (name_ == "wpkh") && (!parent_name.empty()) && (parent_name != "sh")) {
      warn(CFD_LOG_SOURCE, "Failed to wpkh parent. only top or sh.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to wpkh parent. only top or sh.");
    } else if (
        ((name_ == "wsh") || (name_ == "sh")) &&
        (child_node_[0].node_type_ !=
         DescriptorNodeType::kDescriptorTypeScript)) {
      warn(
          CFD_LOG_SOURCE,
          "Failed to check script type. child is script only. nodetype={}",
          child_node_[0].node_type_);
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to check script type. child is script only.");
    } else if (
        (name_ != "wsh") && (name_ != "sh") &&
        (child_node_[0].node_type_ !=
         DescriptorNodeType::kDescriptorTypeKey)) {
      warn(
          CFD_LOG_SOURCE,
          "Failed to check key-hash type. child is key only. nodetype={}",
          child_node_[0].node_type_);
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to check key-hash type. child is key only.");
    } else if ((parent_name == "tr") && (name_ == "pkh")) {
      warn(CFD_LOG_SOURCE, "Failed to taproot. pkh is unsupported.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to taproot. pkh is unsupported.");
    }
    child_node_[0].parent_kind_ = parent_kind_;
    child_node_[0].AnalyzeAll(name_);

    if ((name_ == "wpkh") || (name_ == "wsh")) {
      if (ExistUncompressedKey()) {
        warn(
            CFD_LOG_SOURCE,
            "Failed to unsing uncompressed pubkey."
            " witness cannot uncompressed pubkey.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to unsing uncompressed pubkey.");
      }
    }
  }
  script_type_ = p_data->type;
}